

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  UEFIToolApplication a;
  undefined **local_28 [2];
  UEFITool *local_18;
  int local_c;
  
  local_c = argc;
  UEFIToolApplication::UEFIToolApplication((UEFIToolApplication *)local_28,&local_c,argv);
  iVar1 = UEFIToolApplication::startup((UEFIToolApplication *)local_28);
  local_28[0] = &PTR_metaObject_002b2420;
  if (local_18 != (UEFITool *)0x0) {
    (**(code **)(*(long *)local_18 + 0x20))();
  }
  QApplication::~QApplication((QApplication *)local_28);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    UEFIToolApplication a(argc, argv);
    return a.startup();
}